

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O1

bool ON_IsAnnotationFractionNumber
               (double value,bool bImproperFraction,double *sign,double *proper,double *numerator,
               double *denominator)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  double dVar4;
  ulong in_XMM0_Qb;
  double i;
  double local_60;
  double local_58;
  ulong uStack_50;
  double local_48;
  double local_40;
  double local_38;
  
  if (sign != (double *)0x0) {
    *sign = (double)(-(ulong)(value < 0.0) & 0xbff0000000000000 |
                    ~-(ulong)(value < 0.0) & -(ulong)(0.0 < value) & 0x3ff0000000000000);
  }
  if (proper != (double *)0x0) {
    *proper = 0.0;
  }
  if (numerator != (double *)0x0) {
    *numerator = value;
  }
  if (denominator != (double *)0x0) {
    *denominator = 1.0;
  }
  local_58 = value;
  uStack_50 = in_XMM0_Qb;
  bVar1 = ON_IsValid(value);
  if (bVar1) {
    local_58 = ABS(local_58);
    uStack_50 = uStack_50 & 0x7fffffffffffffff;
    local_60 = 0.0;
    local_40 = modf(local_58,&local_60);
    local_58 = local_58 * 8.881784197001252e-16;
    if (local_58 < local_40) {
      lVar2 = 0;
      while( true ) {
        local_48 = *(double *)((long)&DAT_006dc9b0 + lVar2);
        local_38 = local_40 * local_48;
        dVar4 = floor(local_38);
        uVar3 = -(ulong)(0.5 < local_38 - dVar4);
        dVar4 = (double)(~uVar3 & (ulong)dVar4 | (ulong)(dVar4 + 1.0) & uVar3);
        if (ABS(dVar4 - local_38) <= local_58) break;
        lVar2 = lVar2 + 8;
        if (lVar2 == 0x48) {
          return lVar2 != 0x48;
        }
      }
      if ((!bImproperFraction) && (1.0 <= local_60)) {
        if (proper != (double *)0x0) {
          *proper = local_60;
        }
        local_60 = 0.0;
      }
      if (numerator != (double *)0x0) {
        *numerator = local_60 * local_48 + dVar4;
      }
      if (denominator == (double *)0x0) {
        return true;
      }
      *denominator = local_48;
      return true;
    }
  }
  return false;
}

Assistant:

static
bool ON_IsAnnotationFractionNumber(
  double value,
  bool bImproperFraction,
  double* sign,
  double* proper,
  double* numerator,
  double* denominator
)
{
  if (nullptr != sign)
    *sign = (value < 0.0) ? -1.0 : ((value > 0.0) ? 1.0 : 0.0);
  if (nullptr != proper)
    *proper = 0.0;
  if (nullptr != numerator)
    *numerator = value;
  if (nullptr != denominator)
    *denominator = 1.0;
  if (!ON_IsValid(value))
    return false;

  const double a = fabs(value);
  double i = 0.0;
  const double f = modf(a, &i);

  const double tol = 4.0*ON_EPSILON*a;

  if ( !(f > tol) )
    return false;

  // terminate this list with 0.0.
  const double d[] = { 2.0, 3.0, 4.0, 8.0, 10.0, 16.0, 32.0, 64.0, 128.0, 0.0 };
  for (size_t k = 0; d[k] > 0.0; k++)
  {
    const double y = d[k] * f;
    double x = floor(y);
    if (y - x > 0.5)
      x += 1.0;
    if (!(fabs(x - y) <= tol))
      continue;
    if (false == bImproperFraction && i >= 1.0)
    {
      if (nullptr != proper)
        *proper = i;
      i = 0.0;
    }
    if (nullptr != numerator)
      *numerator = i*d[k] + x;
    if (nullptr != denominator)
      *denominator = d[k];
    return true;
  }

  return false;
}